

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_sot(opj_j2k_t *j2k)

{
  long lVar1;
  opj_cio_t *cio_00;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  int *__dest;
  long lVar8;
  void *pvVar9;
  undefined8 *in_RDI;
  bool bVar10;
  opj_tccp_t *tmp;
  opj_cio_t *cio;
  opj_cp_t *cp;
  char status;
  opj_tcp_t *tcp;
  int i;
  int numparts;
  int partno;
  int totlen;
  int tileno;
  int len;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint local_20;
  uint local_1c;
  uint local_14;
  
  bVar10 = false;
  lVar1 = in_RDI[0xc];
  cio_00 = (opj_cio_t *)in_RDI[0xe];
  cio_read((opj_cio_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
           in_stack_ffffffffffffffac);
  uVar4 = cio_read((opj_cio_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
  if (*(int *)(lVar1 + 0x58) == 0) {
    *(uint *)(*(long *)(lVar1 + 0x50) + (long)*(int *)(lVar1 + 0x58) * 4) = uVar4;
    *(int *)(lVar1 + 0x58) = *(int *)(lVar1 + 0x58) + 1;
  }
  else {
    for (local_20 = 0; bVar3 = (int)local_20 < *(int *)(lVar1 + 0x58),
        in_stack_ffffffffffffffb7 = bVar3 && !bVar10, bVar3 && !bVar10; local_20 = local_20 + 1) {
      bVar10 = *(uint *)(*(long *)(lVar1 + 0x50) + (long)(int)local_20 * 4) == uVar4;
    }
    if (!bVar10) {
      *(uint *)(*(long *)(lVar1 + 0x50) + (long)*(int *)(lVar1 + 0x58) * 4) = uVar4;
      *(int *)(lVar1 + 0x58) = *(int *)(lVar1 + 0x58) + 1;
    }
  }
  local_14 = cio_read((opj_cio_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  if (local_14 == 0) {
    iVar5 = cio_numbytesleft(cio_00);
    local_14 = iVar5 + 8;
  }
  uVar6 = cio_read((opj_cio_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
  local_1c = cio_read((opj_cio_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  if ((int)local_1c <= (int)uVar6) {
    opj_event_msg((opj_common_ptr)*in_RDI,2,
                  "SOT marker inconsistency in tile %d: tile-part index greater (%d) than number of tile-parts (%d)\n"
                  ,(ulong)uVar4,(ulong)uVar6,(ulong)local_1c);
    local_1c = uVar6 + 1;
  }
  *(uint *)((long)in_RDI + 0xc) = uVar4;
  *(uint *)((long)in_RDI + 0x14) = uVar6;
  puVar7 = cio_getbp(cio_00);
  in_RDI[5] = puVar7 + (long)(int)local_14 + -0xc;
  *(undefined4 *)(in_RDI + 1) = 0x10;
  __dest = (int *)(*(long *)(lVar1 + 0x80) + (long)*(int *)((long)in_RDI + 0xc) * 0x15e8);
  if (in_RDI[0xd] != 0) {
    if (*__dest == 0) {
      lVar8 = *(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260;
      *(uint *)(lVar8 + 0x14) = local_14 + *(int *)(lVar8 + 0x14);
    }
    else {
      if (uVar4 == 0) {
        iVar5 = cio_tell(cio_00);
        *(int *)(in_RDI[0xd] + 0x60) = iVar5 + -0xd;
      }
      *(uint *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 8) = uVar4;
      iVar5 = cio_tell(cio_00);
      *(int *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 0xc) = iVar5 + -0xc;
      *(uint *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 0x14) =
           *(int *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 0xc) + local_14 + -1;
    }
    *(uint *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 0x254) = local_1c;
    if (local_1c == 0) {
      pvVar9 = realloc(*(void **)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600),
                       200);
      *(void **)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600) = pvVar9;
    }
    else {
      pvVar9 = realloc(*(void **)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600),
                       (long)(int)local_1c * 0x14);
      *(void **)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600) = pvVar9;
    }
    iVar5 = cio_tell(cio_00);
    *(int *)(*(long *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600) +
            (long)(int)uVar6 * 0x14) = iVar5 + -0xc;
    *(uint *)(*(long *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600) +
              (long)(int)uVar6 * 0x14 + 8) =
         *(int *)(*(long *)(*(long *)(in_RDI[0xd] + 0x68) + (long)(int)uVar4 * 0x260 + 600) +
                 (long)(int)uVar6 * 0x14) + local_14 + -1;
  }
  if (*__dest == 1) {
    uVar2 = *(undefined8 *)(__dest + 0x578);
    memcpy(__dest,(void *)in_RDI[10],0x15e8);
    __dest[0x510] = 0;
    __dest[0x50c] = 0;
    __dest[0x50d] = 0;
    __dest[0x50e] = 0;
    __dest[0x50f] = 0;
    *(undefined8 *)(__dest + 0x578) = uVar2;
    for (local_20 = 0; local_20 < *(uint *)(in_RDI[0xb] + 0x10); local_20 = local_20 + 1) {
      memcpy((void *)(*(long *)(__dest + 0x578) + (long)(int)local_20 * 0x438),
             (void *)(*(long *)(in_RDI[10] + 0x15e0) + (long)(int)local_20 * 0x438),0x438);
    }
    *(undefined4 *)(*(long *)(lVar1 + 0x80) + (long)*(int *)((long)in_RDI + 0xc) * 0x15e8) = 0;
  }
  return;
}

Assistant:

static void j2k_read_sot(opj_j2k_t *j2k) {
	int len, tileno, totlen, partno, numparts, i;
	opj_tcp_t *tcp = NULL;
	char status = 0;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;

	len = cio_read(cio, 2);
	tileno = cio_read(cio, 2);

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		static int backup_tileno = 0;

		/* tileno is negative or larger than the number of tiles!!! */
		if ((tileno < 0) || (tileno > (cp->tw * cp->th))) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad tile number (%d out of a maximum of %d)\n",
				tileno, (cp->tw * cp->th));
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			tileno = backup_tileno;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting tile number to %d\n",
				tileno);
		}

		/* keep your private count of tiles */
		backup_tileno++;
	};
#endif /* USE_JPWL */
	
	if (cp->tileno_size == 0) {
		cp->tileno[cp->tileno_size] = tileno;
		cp->tileno_size++;
	} else {
		i = 0;
		while (i < cp->tileno_size && status == 0) {
			status = cp->tileno[i] == tileno ? 1 : 0;
			i++;
		}
		if (status == 0) {
			cp->tileno[cp->tileno_size] = tileno;
			cp->tileno_size++;
		}
	}
	
	totlen = cio_read(cio, 4);

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		/* totlen is negative or larger than the bytes left!!! */
		if ((totlen < 0) || (totlen > (cio_numbytesleft(cio) + 8))) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad tile byte size (%d bytes against %d bytes left)\n",
				totlen, cio_numbytesleft(cio) + 8);
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			totlen = 0;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting Psot to %d => assuming it is the last tile\n",
				totlen);
		}

	};
#endif /* USE_JPWL */

	if (!totlen)
		totlen = cio_numbytesleft(cio) + 8;
	
	partno = cio_read(cio, 1);
	numparts = cio_read(cio, 1);
  
  if (partno >= numparts) {
    opj_event_msg(j2k->cinfo, EVT_WARNING, "SOT marker inconsistency in tile %d: tile-part index greater (%d) than number of tile-parts (%d)\n", tileno, partno, numparts);
    numparts = partno+1;
  }
	
	j2k->curtileno = tileno;
	j2k->cur_tp_num = partno;
	j2k->eot = cio_getbp(cio) - 12 + totlen;
	j2k->state = J2K_STATE_TPH;
	tcp = &cp->tcps[j2k->curtileno];

	/* Index */
	if (j2k->cstr_info) {
		if (tcp->first) {
			if (tileno == 0) 
				j2k->cstr_info->main_head_end = cio_tell(cio) - 13;
			j2k->cstr_info->tile[tileno].tileno = tileno;
			j2k->cstr_info->tile[tileno].start_pos = cio_tell(cio) - 12;
			j2k->cstr_info->tile[tileno].end_pos = j2k->cstr_info->tile[tileno].start_pos + totlen - 1;				
    } else {
			j2k->cstr_info->tile[tileno].end_pos += totlen;
		}
    j2k->cstr_info->tile[tileno].num_tps = numparts;
    if (numparts)
      j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_realloc(j2k->cstr_info->tile[tileno].tp, numparts * sizeof(opj_tp_info_t));
    else
      j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_realloc(j2k->cstr_info->tile[tileno].tp, 10 * sizeof(opj_tp_info_t)); /* Fixme (10)*/
		j2k->cstr_info->tile[tileno].tp[partno].tp_start_pos = cio_tell(cio) - 12;
		j2k->cstr_info->tile[tileno].tp[partno].tp_end_pos = 
			j2k->cstr_info->tile[tileno].tp[partno].tp_start_pos + totlen - 1;
	}
	
	if (tcp->first == 1) {		
		/* Initialization PPT */
		opj_tccp_t *tmp = tcp->tccps;
		memcpy(tcp, j2k->default_tcp, sizeof(opj_tcp_t));
		tcp->ppt = 0;
		tcp->ppt_data = NULL;
		tcp->ppt_data_first = NULL;
		tcp->tccps = tmp;

		for (i = 0; i < j2k->image->numcomps; i++) {
			tcp->tccps[i] = j2k->default_tcp->tccps[i];
		}
		cp->tcps[j2k->curtileno].first = 0;
	}
}